

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

char * merge(char *a,char *b,_func_int_char_ptr_char_ptr *cmp,int offset)

{
  int iVar1;
  int in_ECX;
  code *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *head;
  char *ptr;
  char *local_30;
  char *local_28;
  char *local_10;
  char *local_8;
  
  local_30 = in_RSI;
  if ((in_RDI != (char *)0x0) && (local_30 = in_RDI, in_RSI != (char *)0x0)) {
    iVar1 = (*in_RDX)(in_RDI,in_RSI);
    if (iVar1 < 1) {
      local_8 = *(char **)(in_RDI + in_ECX);
      local_28 = in_RDI;
      local_10 = in_RSI;
    }
    else {
      local_10 = *(char **)(in_RSI + in_ECX);
      local_28 = in_RSI;
      local_8 = in_RDI;
    }
    local_30 = local_28;
    while (local_8 != (char *)0x0 && local_10 != (char *)0x0) {
      iVar1 = (*in_RDX)(local_8,local_10);
      if (iVar1 < 1) {
        *(char **)(local_28 + in_ECX) = local_8;
        local_28 = local_8;
        local_8 = *(char **)(local_8 + in_ECX);
      }
      else {
        *(char **)(local_28 + in_ECX) = local_10;
        local_28 = local_10;
        local_10 = *(char **)(local_10 + in_ECX);
      }
    }
    if (local_8 == (char *)0x0) {
      *(char **)(local_28 + in_ECX) = local_10;
    }
    else {
      *(char **)(local_28 + in_ECX) = local_8;
    }
  }
  return local_30;
}

Assistant:

static char *merge(
  char *a,
  char *b,
  int (*cmp)(const char*,const char*),
  int offset
){
  char *ptr, *head;

  if( a==0 ){
    head = b;
  }else if( b==0 ){
    head = a;
  }else{
    if( (*cmp)(a,b)<=0 ){
      ptr = a;
      a = NEXT(a);
    }else{
      ptr = b;
      b = NEXT(b);
    }
    head = ptr;
    while( a && b ){
      if( (*cmp)(a,b)<=0 ){
        NEXT(ptr) = a;
        ptr = a;
        a = NEXT(a);
      }else{
        NEXT(ptr) = b;
        ptr = b;
        b = NEXT(b);
      }
    }
    if( a ) NEXT(ptr) = a;
    else    NEXT(ptr) = b;
  }
  return head;
}